

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O3

void sf_base64decode(sf_vec *dest,sf_vec *src)

{
  uint8_t *puVar1;
  byte bVar2;
  size_t sVar3;
  uint8_t *puVar4;
  byte bVar5;
  sbyte sVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long lVar11;
  
  uVar7 = src->len;
  if ((uVar7 & 3) != 0) {
    __assert_fail("(src->len & 0x3) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x44a,"void sf_base64decode(sf_vec *, const sf_vec *)");
  }
  if (uVar7 == 0) {
    sVar3 = src->len;
    dest->base = src->base;
    dest->len = sVar3;
  }
  else {
    puVar9 = src->base + uVar7;
    puVar4 = dest->base;
    puVar10 = src->base;
    do {
      puVar1 = puVar10 + 4;
      lVar11 = 0;
      bVar5 = 0x12;
      uVar8 = 0;
      do {
        bVar2 = puVar10[lVar11];
        if (sf_base64decode::index_tbl[bVar2] == -1) {
          if (lVar11 + 1U < 3) {
            __assert_fail("i > 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                          ,0x45d,"void sf_base64decode(sf_vec *, const sf_vec *)");
          }
          if (lVar11 == 2) {
            if (((bVar2 != 0x3d) || (puVar10[3] != '=')) || (uVar7 != 4)) {
              __assert_fail("*p == \'=\' && *(p + 1) == \'=\' && p + 2 == end",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                            ,0x460,"void sf_base64decode(sf_vec *, const sf_vec *)");
            }
            lVar11 = 1;
            sVar6 = 0x10;
            puVar9 = puVar4;
          }
          else {
            if ((bVar2 != 0x3d) || (uVar7 - 1 != lVar11)) {
              __assert_fail("*p == \'=\' && p + 1 == end",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                            ,0x467,"void sf_base64decode(sf_vec *, const sf_vec *)");
            }
            puVar9 = puVar4 + 1;
            *puVar4 = (uint8_t)(uVar8 >> 0x10);
            lVar11 = 2;
            sVar6 = 8;
          }
          puVar4 = puVar4 + lVar11;
          *puVar9 = (uint8_t)(uVar8 >> sVar6);
          goto LAB_0011790d;
        }
        uVar8 = uVar8 + (sf_base64decode::index_tbl[bVar2] << (bVar5 & 0x1f));
        lVar11 = lVar11 + 1;
        bVar5 = bVar5 - 6;
      } while (lVar11 != 4);
      *puVar4 = (uint8_t)(uVar8 >> 0x10);
      puVar4[1] = (uint8_t)(uVar8 >> 8);
      puVar4[2] = (uint8_t)uVar8;
      puVar4 = puVar4 + 3;
      uVar7 = uVar7 - 4;
      puVar10 = puVar1;
    } while (puVar1 != puVar9);
LAB_0011790d:
    dest->len = (long)puVar4 - (long)dest->base;
  }
  return;
}

Assistant:

void sf_base64decode(sf_vec *dest, const sf_vec *src) {
  static const int index_tbl[] = {
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, 62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60,
    61, -1, -1, -1, -1, -1, -1, -1, 0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10,
    11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1,
    -1, -1, 26, 27, 28, 29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42,
    43, 44, 45, 46, 47, 48, 49, 50, 51, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1};
  uint8_t *o;
  const uint8_t *p, *end;
  uint32_t n;
  size_t i;
  int idx;

  assert((src->len & 0x3) == 0);

  if (src->len == 0) {
    *dest = *src;

    return;
  }

  o = dest->base;
  p = src->base;
  end = src->base + src->len;

  for (; p != end;) {
    n = 0;

    for (i = 1; i <= 4; ++i, ++p) {
      idx = index_tbl[*p];

      if (idx == -1) {
        assert(i > 2);

        if (i == 3) {
          assert(*p == '=' && *(p + 1) == '=' && p + 2 == end);

          *o++ = (uint8_t)(n >> 16);

          goto fin;
        }

        assert(*p == '=' && p + 1 == end);

        *o++ = (uint8_t)(n >> 16);
        *o++ = (n >> 8) & 0xffu;

        goto fin;
      }

      n += (uint32_t)(idx << (24 - i * 6));
    }

    *o++ = (uint8_t)(n >> 16);
    *o++ = (n >> 8) & 0xffu;
    *o++ = n & 0xffu;
  }

fin:
  dest->len = (size_t)(o - dest->base);
}